

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall ICM::Function::SignTree::insert(SignTree *this,FuncObject *funcO)

{
  Signature *pSVar1;
  FuncObject *pFVar2;
  vector<std::vector<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*,std::allocator<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*>>,std::allocator<std::vector<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*,std::allocator<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*>>>>
  *pvVar3;
  Node *pNVar4;
  long lVar5;
  pointer pvVar6;
  _Head_base<0UL,_ICM::Function::SignTree::Node_*,_false> this_00;
  long lVar7;
  long lVar8;
  element_type *to;
  _Vector_base<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>
  local_68;
  FuncObject *local_48;
  vector<std::vector<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*,std::allocator<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*>>,std::allocator<std::vector<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*,std::allocator<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*>>>>
  *local_40;
  long local_38;
  
  to = (funcO->sign).InType._data.super___shared_ptr<ICM::TypeObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_40 = (vector<std::vector<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*,std::allocator<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*>>,std::allocator<std::vector<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*,std::allocator<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*>>>>
              *)&this->level;
  lVar7 = (funcO->sign).InType._capacity * -0x18;
  lVar5 = 1;
  this_00._M_head_impl =
       (this->root)._M_t.
       super___uniq_ptr_impl<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>
       ._M_t.
       super__Tuple_impl<0UL,_ICM::Function::SignTree::Node_*,_std::default_delete<ICM::Function::SignTree::Node>_>
       .super__Head_base<0UL,_ICM::Function::SignTree::Node_*,_false>._M_head_impl;
  local_48 = funcO;
  local_38 = lVar7;
  for (lVar8 = 0x18; pFVar2 = local_48, lVar8 + lVar7 != 0x18; lVar8 = lVar8 + 0x18) {
    pNVar4 = Node::find(this_00._M_head_impl,to);
    if (pNVar4 == (Node *)0x0) {
      local_68._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
      pSVar1 = to->sign;
      *local_68._M_impl.super__Vector_impl_data._M_start =
           *(vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>
             **)to;
      local_68._M_impl.super__Vector_impl_data._M_start[1] =
           (vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>
            *)pSVar1;
      local_68._M_impl.super__Vector_impl_data._M_start[2] =
           (vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>
            *)to->functableunit;
      pNVar4 = Node::push(this_00._M_head_impl,(TypeObjectPtr *)&local_68);
      pvVar3 = local_40;
      pvVar6 = (this->level).
               super__Vector_base<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (lVar5 == ((long)(this->level).
                          super__Vector_base<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) / 0x18) {
        local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*,std::allocator<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*>>,std::allocator<std::vector<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*,std::allocator<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*>>>>
        ::
        emplace_back<std::vector<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*,std::allocator<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*>>>
                  (local_40,(vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>
                             *)&local_68);
        std::
        _Vector_base<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>
        ::~_Vector_base(&local_68);
        pvVar6 = *(pointer *)pvVar3;
      }
      local_68._M_impl.super__Vector_impl_data._M_start = (pointer)&pNVar4->children;
      std::
      vector<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*,std::allocator<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*>>
      ::
      emplace_back<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*>
                ((vector<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*,std::allocator<std::vector<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>,std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,std::default_delete<ICM::Function::SignTree::Node>>>>const*>>
                  *)((long)&(pvVar6->
                            super__Vector_base<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>
                            )._M_impl.super__Vector_impl_data + lVar8),
                 (vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>
                  **)&local_68);
      lVar7 = local_38;
    }
    lVar5 = lVar5 + 1;
    to = to + 1;
    this_00._M_head_impl = pNVar4;
  }
  if ((local_48->sign).last_is_args != false) {
    (this_00._M_head_impl)->isargs = true;
  }
  Node::pushEnd(this_00._M_head_impl,
                (long)(this->funcdata).
                      super__Vector_base<const_ICM::Function::FuncObject_*,_std::allocator<const_ICM::Function::FuncObject_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->funcdata).
                      super__Vector_base<const_ICM::Function::FuncObject_*,_std::allocator<const_ICM::Function::FuncObject_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)pFVar2;
  std::vector<ICM::Function::FuncObject_const*,std::allocator<ICM::Function::FuncObject_const*>>::
  emplace_back<ICM::Function::FuncObject_const*>
            ((vector<ICM::Function::FuncObject_const*,std::allocator<ICM::Function::FuncObject_const*>>
              *)&this->funcdata,(FuncObject **)&local_68);
  return;
}

Assistant:

void setArgs() {
					isargs = true;
				}